

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

bool __thiscall helics::CoreBroker::allInitReady(CoreBroker *this)

{
  bool bVar1;
  ConnectionState CVar2;
  int iVar3;
  size_type sVar4;
  reference pBVar5;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *in_RDI;
  bool initReady;
  BasicBrokerInfo *brk;
  const_iterator __end2;
  const_iterator __begin2;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *__range2;
  int32_t children;
  undefined4 in_stack_ffffffffffffffc0;
  GlobalBrokerId in_stack_ffffffffffffffc4;
  __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  local_28;
  CoreBroker *in_stack_ffffffffffffffe0;
  int local_14;
  bool local_1;
  
  sVar4 = gmlc::containers::
          DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
          ::size((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                  *)0x5108fe);
  if ((int)sVar4 < (int)(in_RDI->lookup1)._M_h._M_bucket_count) {
    local_1 = false;
  }
  else {
    sVar4 = gmlc::containers::
            DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
            ::size((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                    *)0x510921);
    if ((int)sVar4 < *(int *)((long)&(in_RDI->lookup1)._M_h._M_bucket_count + 4)) {
      local_1 = false;
    }
    else {
      if (0 < (int)(in_RDI->lookup1)._M_h._M_element_count) {
        local_14 = 0;
        in_stack_ffffffffffffffe0 = (CoreBroker *)&in_RDI[4].lookup2;
        local_28._M_current =
             (BasicBrokerInfo *)
             gmlc::containers::
             DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
             ::begin(in_RDI);
        gmlc::containers::
        DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
        ::end(in_RDI);
        while (bVar1 = __gnu_cxx::
                       operator==<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                                 ((__normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                                   *)CONCAT44(in_stack_ffffffffffffffc4.gid,
                                              in_stack_ffffffffffffffc0),
                                  (__normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                                   *)in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
          pBVar5 = __gnu_cxx::
                   __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                   ::operator*(&local_28);
          in_stack_ffffffffffffffc4.gid =
               *(BaseType *)
                ((long)&(in_RDI->dataStorage).
                        super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
          bVar1 = GlobalBrokerId::operator==(&pBVar5->parent,in_stack_ffffffffffffffc4);
          if (bVar1) {
            local_14 = local_14 + 1;
          }
          __gnu_cxx::
          __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
          ::operator++(&local_28);
        }
        if (local_14 < (int)(in_RDI->lookup1)._M_h._M_element_count) {
          return false;
        }
      }
      CVar2 = getAllConnectionState(in_stack_ffffffffffffffe0);
      if (CVar2 == CONNECTED) {
        local_1 = false;
      }
      else {
        iVar3 = getCountableFederates(in_stack_ffffffffffffffe0);
        local_1 = (int)(in_RDI->lookup1)._M_h._M_bucket_count <= iVar3;
      }
    }
  }
  return local_1;
}

Assistant:

bool CoreBroker::allInitReady() const
{
    // the federate count must be greater than the min size
    if (static_cast<decltype(minFederateCount)>(mFederates.size()) < minFederateCount) {
        return false;
    }
    if (static_cast<decltype(minBrokerCount)>(mBrokers.size()) < minBrokerCount) {
        return false;
    }
    if (minChildCount > 0) {
        decltype(minChildCount) children{0U};
        for (const auto& brk : mBrokers) {
            if (brk.parent == global_broker_id_local) {
                ++children;
            }
        }
        if (children < minChildCount) {
            return false;
        }
    }
    const bool initReady = (getAllConnectionState() >= ConnectionState::INIT_REQUESTED);
    if (initReady) {
        // now do a more formal count of federates as there may be non-counting ones
        return (getCountableFederates() >= minFederateCount);
    }
    return false;
}